

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.cpp
# Opt level: O2

int higan::Codec::HexCharArrayToInt(char *begin,char *end)

{
  char character;
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  if (begin < end) {
    iVar2 = ~(uint)begin + (int)end;
    iVar3 = 0;
    for (; begin != end; begin = begin + 1) {
      character = *begin;
      dVar4 = (double)iVar2;
      iVar2 = iVar2 + -1;
      dVar4 = exp2(dVar4 * 4.0);
      iVar1 = HexCharToInt(character);
      iVar3 = (int)((double)iVar1 * dVar4 + (double)iVar3);
    }
    iVar2 = -1;
    if (-1 < iVar3) {
      iVar2 = iVar3;
    }
    return iVar2;
  }
  return -1;
}

Assistant:

int Codec::HexCharArrayToInt(const char* begin, const char* end)
{
	if (end <= begin)
	{
		return -1;
	}

	int index = end - begin - 1;

	int result = 0;

	std::for_each(begin, end, [&](char i)
	{
		result += std::pow(16, index--) * HexCharToInt(i);
	});

	return result < 0 ? -1 : result;
}